

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  InlinedStringField *pIVar5;
  ArenaStringPtr *this_00;
  string *psVar6;
  FieldDescriptor *in_RCX;
  long *in_RSI;
  string *in_RDI;
  undefined4 in_stack_00000048;
  CppType in_stack_0000004c;
  Descriptor *in_stack_00000050;
  string *in_stack_00000058;
  undefined4 in_stack_00000060;
  int in_stack_00000064;
  ExtensionSet *in_stack_00000068;
  FieldDescriptor *in_stack_ffffffffffffffa8;
  Reflection *in_stack_ffffffffffffffb0;
  
  pDVar4 = FieldDescriptor::containing_type(in_RCX);
  if (pDVar4 != (Descriptor *)*in_RSI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000050,(FieldDescriptor *)CONCAT44(in_stack_0000004c,in_stack_00000048),
               (char *)this,(char *)message);
  }
  LVar2 = FieldDescriptor::label(in_RCX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000050,(FieldDescriptor *)CONCAT44(in_stack_0000004c,in_stack_00000048),
               (char *)this,(char *)message);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x414bbc);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)CONCAT44(in_stack_00000064,in_stack_00000060),
               (FieldDescriptor *)in_stack_00000058,(char *)in_stack_00000050,in_stack_0000004c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RCX);
  if (bVar1) {
    GetExtensionSet(in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    FieldDescriptor::number(in_RCX);
    FieldDescriptor::default_value_string_abi_cxx11_(in_RCX);
    psVar6 = internal::ExtensionSet::GetString
                       (in_stack_00000068,in_stack_00000064,in_stack_00000058);
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar6);
  }
  else {
    FieldDescriptor::options(in_RCX);
    FieldOptions::ctype((FieldOptions *)0x414c50);
    bVar1 = IsInlined(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (bVar1) {
      pIVar5 = GetField<google::protobuf::internal::InlinedStringField>
                         (in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8,
                          (FieldDescriptor *)0x414c81);
      std::__cxx11::string::string((string *)in_RDI,(string *)pIVar5);
    }
    else {
      this_00 = GetField<google::protobuf::internal::ArenaStringPtr>
                          (in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8,
                           (FieldDescriptor *)0x414cab);
      psVar6 = internal::ArenaStringPtr::Get_abi_cxx11_(this_00);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar6);
    }
  }
  return in_RDI;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }
  }
}